

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureblitter.cpp
# Opt level: O3

QMatrix4x4 *
QOpenGLTextureBlitter::targetTransform
          (QMatrix4x4 *__return_storage_ptr__,QRectF *target,QRect *viewport)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  iVar3 = (viewport->x1).m_i;
  uVar4 = viewport->x1;
  uVar5 = viewport->y1;
  auVar8._0_8_ = target->xp - (double)(int)uVar4;
  auVar8._8_8_ = -(target->yp - (double)(int)uVar5);
  iVar6 = (viewport->x1).m_i;
  iVar7 = (viewport->y1).m_i;
  *(float *)((long)(__return_storage_ptr__->m + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 0) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->m[0] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->m + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 2) + 4) = 0.0;
  __return_storage_ptr__->m[2][2] = 1.0;
  *(undefined8 *)(__return_storage_ptr__->m[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->m + 3) + 8) = 0.0;
  __return_storage_ptr__->m[3][3] = 1.0;
  uVar1 = viewport->x2;
  uVar2 = viewport->y2;
  auVar9._0_8_ = (double)((uVar1 + 1) - iVar6);
  auVar9._8_8_ = (double)((uVar2 + 1) - iVar7);
  auVar11._0_8_ = target->w;
  auVar11._8_8_ = target->h;
  auVar8 = divpd(auVar8,auVar9);
  auVar10._0_8_ = (double)((uVar1 + 1) - iVar3);
  auVar10._8_8_ = auVar9._8_8_;
  auVar11 = divpd(auVar11,auVar10);
  *(ulong *)__return_storage_ptr__->m[3] =
       CONCAT44((float)(auVar8._8_8_ + auVar8._8_8_ + (1.0 - auVar11._8_8_)),
                (float)(auVar8._0_8_ + auVar8._0_8_ + auVar11._0_8_ + -1.0));
  __return_storage_ptr__->m[0][0] = (float)auVar11._0_8_;
  (__return_storage_ptr__->flagBits).super_QFlagsStorageHelper<QMatrix4x4::Flag,_4>.
  super_QFlagsStorage<QMatrix4x4::Flag>.i = 0x1f;
  __return_storage_ptr__->m[1][1] = (float)auVar11._8_8_;
  return __return_storage_ptr__;
}

Assistant:

QMatrix4x4 QOpenGLTextureBlitter::targetTransform(const QRectF &target,
                                                  const QRect &viewport)
{
    qreal x_scale = target.width() / viewport.width();
    qreal y_scale = target.height() / viewport.height();

    const QPointF relative_to_viewport = target.topLeft() - viewport.topLeft();
    qreal x_translate = x_scale - 1 + ((relative_to_viewport.x() / viewport.width()) * 2);
    qreal y_translate = -y_scale + 1 - ((relative_to_viewport.y() / viewport.height()) * 2);

    QMatrix4x4 matrix;
    matrix(0,3) = x_translate;
    matrix(1,3) = y_translate;

    matrix(0,0) = x_scale;
    matrix(1,1) = y_scale;

    return matrix;
}